

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
          (void *param_1,object_storage *param_2)

{
  object_storage *poVar1;
  object_storage *this;
  object_storage temp;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  object_storage local_28;
  object_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  poVar1 = cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                     (in_stack_ffffffffffffffc0);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::object_storage::
  object_storage(&local_28,poVar1);
  poVar1 = local_18;
  this = cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             poVar1);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage&>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
             poVar1);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }